

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O3

void save_load(OjaNewton *ON,io_buf *model_file,bool read,bool text)

{
  vw *all;
  ostream *poVar1;
  undefined7 in_register_00000011;
  bool resume;
  stringstream msg;
  char local_1b9;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  all = ON->all;
  if ((int)CONCAT71(in_register_00000011,read) != 0) {
    initialize_regressor(all);
    OjaNewton::initialize_Z(ON,&all->weights);
  }
  if ((model_file->files)._end != (model_file->files)._begin) {
    local_1b9 = all->save_resume;
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    poVar1 = std::ostream::_M_insert<bool>(SUB81((ostream *)local_1a8,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    if (read) {
      io_buf::bin_read_fixed(model_file,&local_1b9,1,"");
    }
    else {
      bin_text_write_fixed(model_file,&local_1b9,1,(stringstream *)local_1b8,text);
    }
    if (local_1b9 == '\x01') {
      GD::save_load_online_state(all,model_file,read,text,(gd *)0x0);
    }
    else {
      GD::save_load_regressor(all,model_file,read,text);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return;
}

Assistant:

void save_load(OjaNewton& ON, io_buf& model_file, bool read, bool text)
{
  vw& all = *ON.all;
  if (read)
  {
    initialize_regressor(all);
    ON.initialize_Z(all.weights);
  }

  if (model_file.files.size() > 0)
  {
    bool resume = all.save_resume;
    stringstream msg;
    msg << ":" << resume << "\n";
    bin_text_read_write_fixed(model_file, (char*)&resume, sizeof(resume), "", read, msg, text);

    if (resume)
      GD::save_load_online_state(all, model_file, read, text);
    else
      GD::save_load_regressor(all, model_file, read, text);
  }
}